

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O3

void __thiscall cmGlobalNinjaGenerator::CloseBuildFileStream(cmGlobalNinjaGenerator *this)

{
  if (this->BuildFileStream != (cmGeneratedFileStream *)0x0) {
    (*(this->BuildFileStream->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
      _vptr_basic_ostream[1])();
    this->BuildFileStream = (cmGeneratedFileStream *)0x0;
    return;
  }
  cmSystemTools::Error("Build file stream was not open.",(char *)0x0,(char *)0x0,(char *)0x0);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::CloseBuildFileStream()
{
  if (this->BuildFileStream) {
    delete this->BuildFileStream;
    this->BuildFileStream = CM_NULLPTR;
  } else {
    cmSystemTools::Error("Build file stream was not open.");
  }
}